

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::InternReadFile_3DGS_MDL7(MDLImporter *this)

{
  undefined8 *puVar1;
  char *__s;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  aiMaterial *this_01;
  aiScene *paVar6;
  pointer ppaVar7;
  pointer ppaVar8;
  undefined8 uVar9;
  ai_uint32 aVar10;
  Logger *pLVar11;
  pointer this_02;
  aiNode *paVar12;
  ulong *puVar13;
  aiMesh **ppaVar14;
  aiNode **ppaVar15;
  uint *puVar16;
  size_t sVar17;
  aiNode *this_03;
  int iVar18;
  int iVar20;
  ulong uVar19;
  MDLImporter *this_04;
  ulong uVar21;
  uint iSkin;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  Header_MDL7 *pHVar25;
  ulong uVar26;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar27;
  uint32_t i;
  long lVar28;
  reference rVar29;
  Header_MDL7 *local_518;
  int iMode;
  float fStack_50c;
  float local_508;
  Header_MDL7 *local_500;
  ulong local_4f8;
  int local_4ec;
  ulong *local_4e8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_4e0;
  void *local_4d8;
  IntSplitGroupData_MDL7 splitGroupData;
  IntSharedData_MDL7 sharedData;
  IntGroupInfo_MDL7 groupInfo;
  IntGroupData_MDL7 groupData;
  
  if (this->pScene != (aiScene *)0x0) {
    this_04 = (MDLImporter *)&sharedData;
    MDL::IntSharedData_MDL7::IntSharedData_MDL7((IntSharedData_MDL7 *)this_04);
    pHVar25 = (Header_MDL7 *)this->mBuffer;
    local_518 = pHVar25 + 1;
    ValidateHeader_3DGS_MDL7(this_04,pHVar25);
    local_518 = (Header_MDL7 *)
                (local_518->ident + (uint)pHVar25->bone_stc_size * pHVar25->bones_num);
    sharedData.apcOutBones = LoadBones_3DGS_MDL7(this);
    uVar23 = (ulong)pHVar25->groups_num;
    local_4e8 = (ulong *)operator_new__(uVar23 * 0x18 + 8);
    *local_4e8 = uVar23;
    pvVar27 = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)(local_4e8 + 1);
    if (uVar23 != 0) {
      uVar23 = uVar23 * 0x18 - 0x18;
      memset(pvVar27,0,(uVar23 - uVar23 % 0x18) + 0x18);
    }
    uVar23 = 0;
    local_4e0 = pvVar27;
    while( true ) {
      uVar19 = (ulong)pHVar25->groups_num;
      if (uVar19 <= uVar23) break;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(pvVar27,3);
      uVar23 = uVar23 + 1;
      pvVar27 = pvVar27 + 1;
    }
    uVar23 = (ulong)(pHVar25->groups_num << 4);
    local_4d8 = operator_new__(uVar23);
    this_00 = &sharedData.pcMats;
    uVar24 = 0;
    local_500 = pHVar25;
    while (pHVar25 = local_518, uVar24 < uVar19) {
      groupInfo.pcGroup = (Group_MDL7 *)local_518;
      groupInfo.pcGroupVerts = (Vertex_MDL7 *)0x0;
      groupInfo.pcGroupUVs = (TexCoord_MDL7 *)0x0;
      groupInfo.pcGroupTris = (Triangle_MDL7 *)0x0;
      local_518 = (Header_MDL7 *)&local_518->bonetrans_stc_size;
      groupInfo.iIndex = (uint)uVar24;
      SizeCheck(this,local_518,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x577);
      if ((char)*(uint16_t *)pHVar25->ident != '\x01') {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,"[3DGS MDL7] Not a triangle mesh group. Continuing happily");
      }
      uVar19 = (ulong)((uint)uVar24 << 4);
      uVar9 = *(undefined8 *)&pHVar25->data_size;
      puVar1 = (undefined8 *)((long)local_4d8 + uVar19);
      *puVar1 = *(undefined8 *)&pHVar25->bones_num;
      puVar1[1] = uVar9;
      *(undefined1 *)((long)local_4d8 + uVar19 + 0xf) = 0;
      local_4f8 = uVar24;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                (this_00,(long)pHVar25->medlump_size +
                         ((long)sharedData.pcMats.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)sharedData.pcMats.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3));
      std::vector<bool,_std::allocator<bool>_>::resize
                (&sharedData.abNeedMaterials,
                 (long)pHVar25->medlump_size +
                 (ulong)sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>.
                        _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                        _M_offset +
                 ((long)sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>.
                        _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>._M_impl
                       .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,false);
      for (uVar22 = 0; uVar22 < (uint)pHVar25->medlump_size; uVar22 = uVar22 + 1) {
        ParseSkinLump_3DGS_MDL7(this,(uchar *)local_518,(uchar **)&local_518,this_00);
      }
      if (sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iMode = 2;
        this_02 = (pointer)operator_new(0x10);
        aiMaterial::aiMaterial((aiMaterial *)this_02);
        groupData.pcFaces.
        super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>.
        _M_impl.super__Vector_impl_data._M_start = this_02;
        std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                  ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)this_00,
                   (aiMaterial **)&groupData);
        this_01 = *sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        aiMaterial::AddProperty<int>(this_01,&iMode,1,"$mat.shadingm",0,0);
        splitGroupData.aiSplit =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x3f19999a3f19999a;
        splitGroupData.shared =
             (IntSharedData_MDL7 *)CONCAT44(splitGroupData.shared._4_4_,0x3f19999a);
        aiMaterial::AddProperty<aiColor3D>
                  (this_01,(aiColor3D *)&splitGroupData,1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>
                  (this_01,(aiColor3D *)&splitGroupData,1,"$clr.specular",0,0);
        splitGroupData.aiSplit =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x3d4ccccd3d4ccccd;
        splitGroupData.shared =
             (IntSharedData_MDL7 *)CONCAT44(splitGroupData.shared._4_4_,0x3d4ccccd);
        aiMaterial::AddProperty<aiColor3D>
                  (this_01,(aiColor3D *)&splitGroupData,1,"$clr.ambient",0,0);
        groupData.pcFaces.
        super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)groupData.pcFaces.
                              super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffff0000000000);
        memset((void *)((long)&groupData.pcFaces.
                               super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start + 5),0x1b,0x3ff);
        aiString::Set((aiString *)&groupData,"DefaultMaterial");
        aiMaterial::AddProperty(this_01,(aiString *)&groupData,"?mat.name",0,0);
        std::vector<bool,_std::allocator<bool>_>::resize(&sharedData.abNeedMaterials,1,false);
      }
      groupInfo.pcGroupUVs = (TexCoord_MDL7 *)local_518;
      iVar18._0_2_ = pHVar25->bone_stc_size;
      iVar18._2_2_ = pHVar25->skin_stc_size;
      groupInfo.pcGroupTris =
           (Triangle_MDL7 *)
           ((long)local_518->ident + (ulong)local_500->skinpoint_stc_size * (long)iVar18);
      iVar20._0_2_ = pHVar25->colorvalue_stc_size;
      iVar20._2_2_ = pHVar25->material_stc_size;
      groupInfo.pcGroupVerts =
           (Vertex_MDL7 *)
           ((long)(groupInfo.pcGroupTris)->v_index +
           (long)iVar20 * (ulong)local_500->triangle_stc_size);
      iVar2._0_2_ = pHVar25->skinpoint_stc_size;
      iVar2._2_2_ = pHVar25->triangle_stc_size;
      local_518 = (Header_MDL7 *)
                  ((long)&(groupInfo.pcGroupVerts)->x +
                  (ulong)local_500->mainvertex_stc_size * (long)iVar2);
      SizeCheck(this,local_518,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x5c2);
      splitGroupData.aiSplit = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0;
      splitGroupData.avOutList = local_4e0 + local_4f8;
      splitGroupData.shared = &sharedData;
      memset(&groupData,0,0x91);
      if ((*(int *)&pHVar25->colorvalue_stc_size == 0) ||
         (iVar3._0_2_ = pHVar25->skinpoint_stc_size, iVar3._2_2_ = pHVar25->triangle_stc_size,
         iVar3 == 0)) {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,
                     "[3DGS MDL7] Mesh group consists of 0 vertices or faces. It will be skipped.");
      }
      else {
        uVar19 = (ulong)(uint)(*(int *)&pHVar25->colorvalue_stc_size * 3);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&groupData.vPositions,uVar19);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&groupData.vNormals,uVar19);
        if (sharedData.apcOutBones != (IntBone_MDL7 **)0x0) {
          iMode = -1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&groupData.aiBones,uVar19,(value_type_conflict4 *)&iMode);
        }
        iVar4._0_2_ = pHVar25->bone_stc_size;
        iVar4._2_2_ = pHVar25->skin_stc_size;
        if (iVar4 != 0) {
          iMode = 0;
          fStack_50c = 0.0;
          local_508 = 0.0;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    (&groupData.vTextureCoords1,uVar19,(value_type *)&iMode);
          if (0x19 < local_500->triangle_stc_size) {
            iMode = 0;
            fStack_50c = 0.0;
            local_508 = 0.0;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&groupData.vTextureCoords2,uVar19,(value_type *)&iMode);
            groupData.bNeed2UV = true;
          }
        }
        iVar5._0_2_ = pHVar25->colorvalue_stc_size;
        iVar5._2_2_ = pHVar25->material_stc_size;
        std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::resize
                  (&groupData.pcFaces,(long)iVar5);
        ReadFaces_3DGS_MDL7(this,&groupInfo,&groupData);
        SortByMaterials_3DGS_MDL7(this,&groupInfo,&groupData,&splitGroupData);
        for (uVar22 = 0; uVar19 = (ulong)uVar22,
            uVar19 < (ulong)((long)sharedData.pcMats.
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)sharedData.pcMats.
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3);
            uVar22 = uVar22 + 1) {
          if ((splitGroupData.aiSplit[uVar19]->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start !=
              (splitGroupData.aiSplit[uVar19]->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            rVar29 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&sharedData.abNeedMaterials,uVar19);
            *rVar29._M_p = *rVar29._M_p | rVar29._M_mask;
          }
        }
      }
      ProcessFrames_3DGS_MDL7
                (this,&groupInfo,&groupData,&sharedData,(uchar *)local_518,(uchar **)&local_518);
      GenerateOutputMeshes_3DGS_MDL7(this,&groupData,&splitGroupData);
      MDL::IntGroupData_MDL7::~IntGroupData_MDL7(&groupData);
      MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7(&splitGroupData);
      uVar19 = (ulong)local_500->groups_num;
      uVar24 = local_4f8 + 1;
    }
    paVar12 = (aiNode *)operator_new(0x478);
    pHVar25 = local_500;
    aiNode::aiNode(paVar12);
    this->pScene->mRootNode = paVar12;
    puVar13 = local_4e8 + 2;
    for (uVar19 = 0; uVar19 < pHVar25->groups_num; uVar19 = uVar19 + 1) {
      puVar16 = &this->pScene->mNumMeshes;
      *puVar16 = *puVar16 + (int)(*puVar13 - puVar13[-1] >> 3);
      puVar13 = puVar13 + 3;
    }
    paVar6 = this->pScene;
    ppaVar14 = (aiMesh **)operator_new__((ulong)paVar6->mNumMeshes << 3);
    pvVar27 = local_4e0;
    paVar6->mMeshes = ppaVar14;
    iVar18 = 0;
    for (uVar19 = 0; uVar19 < pHVar25->groups_num; uVar19 = uVar19 + 1) {
      uVar24 = 0;
      while( true ) {
        iVar20 = (int)uVar24;
        ppaVar7 = local_4e0[uVar19].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppaVar8 = local_4e0[uVar19].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ulong)((long)ppaVar8 - (long)ppaVar7 >> 3) <= uVar24) break;
        this->pScene->mMeshes[(uint)(iVar20 + iVar18)] = ppaVar7[uVar24];
        uVar24 = (ulong)(iVar20 + 1);
      }
      if (ppaVar7 != ppaVar8) {
        puVar16 = &this->pScene->mRootNode->mNumChildren;
        *puVar16 = *puVar16 + 1;
      }
      iVar18 = iVar18 + iVar20;
    }
    if (sharedData.apcOutBones != (IntBone_MDL7 **)0x0) {
      puVar16 = &this->pScene->mRootNode->mNumChildren;
      *puVar16 = *puVar16 + 1;
    }
    paVar6 = this->pScene;
    ppaVar15 = (aiNode **)operator_new__((ulong)paVar6->mRootNode->mNumChildren << 3);
    paVar6->mRootNode->mChildren = ppaVar15;
    uVar19 = 0;
    local_4f8 = local_4f8 & 0xffffffff00000000;
    for (uVar24 = 0; uVar24 < pHVar25->groups_num; uVar24 = uVar24 + 1) {
      if (pvVar27[uVar24].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pvVar27[uVar24].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar12 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar12);
        pvVar27 = pvVar27 + uVar24;
        iVar18 = (int)uVar19;
        this->pScene->mRootNode->mChildren[uVar19] = paVar12;
        uVar21 = (long)(pvVar27->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar27->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        uVar26 = uVar21 >> 3;
        paVar12->mNumMeshes = (uint)uVar26;
        puVar16 = (uint *)operator_new__(uVar21 >> 1 & 0x3fffffffc);
        paVar12->mMeshes = puVar16;
        paVar12->mParent = this->pScene->mRootNode;
        for (uVar21 = 0; uVar21 < (uVar26 & 0xffffffff); uVar21 = uVar21 + 1) {
          paVar12->mMeshes[uVar21] = (int)local_4f8 + (int)uVar21;
          uVar26 = (ulong)paVar12->mNumMeshes;
        }
        ppaVar7 = (pvVar27->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar21 = (ulong)(uint)((int)uVar24 << 4);
        __s = (char *)((long)local_4d8 + uVar21);
        ppaVar8 = (pvVar27->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        local_4ec = iVar18;
        if (*(char *)((long)local_4d8 + uVar21) == '\0') {
          aVar10 = snprintf(__s,uVar23 - uVar21,"Group_%u",uVar19);
        }
        else {
          sVar17 = strlen(__s);
          aVar10 = (ai_uint32)sVar17;
          iVar18 = local_4ec;
        }
        local_4f8 = CONCAT44(local_4f8._4_4_,
                             (int)local_4f8 + (int)((ulong)((long)ppaVar7 - (long)ppaVar8) >> 3));
        (paVar12->mName).length = aVar10;
        strncpy((paVar12->mName).data,__s,0x3ff);
        uVar19 = (ulong)(iVar18 + 1);
        pHVar25 = local_500;
        pvVar27 = local_4e0;
      }
    }
    paVar12 = this->pScene->mRootNode;
    if ((paVar12->mNumChildren == 1) && (sharedData.apcOutBones == (IntBone_MDL7 **)0x0)) {
      this->pScene->mRootNode = *paVar12->mChildren;
      *paVar12->mChildren = (aiNode *)0x0;
      aiNode::~aiNode(paVar12);
      operator_delete(paVar12);
      this->pScene->mRootNode->mParent = (aiNode *)0x0;
    }
    else {
      aiString::Set(&paVar12->mName,"<mesh_root>");
    }
    puVar13 = local_4e8;
    if (*local_4e8 != 0) {
      lVar28 = *local_4e8 * 0x18;
      do {
        std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                  ((_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   ((long)puVar13 + lVar28 + -0x10));
        lVar28 = lVar28 + -0x18;
      } while (lVar28 != 0);
    }
    operator_delete__(local_4e8);
    operator_delete__(local_4d8);
    CopyMaterials_3DGS_MDL7(this,&sharedData);
    HandleMaterialReferences_3DGS_MDL7(this);
    if (sharedData.apcOutBones != (IntBone_MDL7 **)0x0) {
      this_03 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_03);
      paVar12 = this->pScene->mRootNode;
      paVar12->mChildren[paVar12->mNumChildren - 1] = this_03;
      aiString::Set((aiString *)this_03,"<skeleton_root>");
      AddBonesToNodeGraph_3DGS_MDL7(this,sharedData.apcOutBones,this_03,0xffff);
      BuildOutputAnims_3DGS_MDL7(this,sharedData.apcOutBones);
    }
    MDL::IntSharedData_MDL7::~IntSharedData_MDL7(&sharedData);
    return;
  }
  __assert_fail("__null != pScene",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x543,"void Assimp::MDLImporter::InternReadFile_3DGS_MDL7()");
}

Assistant:

void MDLImporter::InternReadFile_3DGS_MDL7( )
{
    ai_assert(NULL != pScene);

    MDL::IntSharedData_MDL7 sharedData;

    // current cursor position in the file
    BE_NCONST MDL::Header_MDL7 *pcHeader = (BE_NCONST MDL::Header_MDL7*)this->mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    AI_SWAP4(pcHeader->version);
    AI_SWAP4(pcHeader->bones_num);
    AI_SWAP4(pcHeader->groups_num);
    AI_SWAP4(pcHeader->data_size);
    AI_SWAP4(pcHeader->entlump_size);
    AI_SWAP4(pcHeader->medlump_size);
    AI_SWAP2(pcHeader->bone_stc_size);
    AI_SWAP2(pcHeader->skin_stc_size);
    AI_SWAP2(pcHeader->colorvalue_stc_size);
    AI_SWAP2(pcHeader->material_stc_size);
    AI_SWAP2(pcHeader->skinpoint_stc_size);
    AI_SWAP2(pcHeader->triangle_stc_size);
    AI_SWAP2(pcHeader->mainvertex_stc_size);
    AI_SWAP2(pcHeader->framevertex_stc_size);
    AI_SWAP2(pcHeader->bonetrans_stc_size);
    AI_SWAP2(pcHeader->frame_stc_size);

    // validate the header of the file. There are some structure
    // sizes that are expected by the loader to be constant
    this->ValidateHeader_3DGS_MDL7(pcHeader);

    // load all bones (they are shared by all groups, so
    // we'll need to add them to all groups/meshes later)
    // apcBonesOut is a list of all bones or NULL if they could not been loaded
    szCurrent += pcHeader->bones_num * pcHeader->bone_stc_size;
    sharedData.apcOutBones = this->LoadBones_3DGS_MDL7();

    // vector to held all created meshes
    std::vector<aiMesh*>* avOutList;

    // 3 meshes per group - that should be OK for most models
    avOutList = new std::vector<aiMesh*>[pcHeader->groups_num];
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        avOutList[i].reserve(3);

    // buffer to held the names of all groups in the file
	const size_t buffersize( AI_MDL7_MAX_GROUPNAMESIZE*pcHeader->groups_num );
	char* aszGroupNameBuffer = new char[ buffersize ];

    // read all groups
    for (unsigned int iGroup = 0; iGroup < (unsigned int)pcHeader->groups_num;++iGroup) {
        MDL::IntGroupInfo_MDL7 groupInfo((BE_NCONST MDL::Group_MDL7*)szCurrent,iGroup);
        szCurrent = (const unsigned char*)(groupInfo.pcGroup+1);

        VALIDATE_FILE_SIZE(szCurrent);

        AI_SWAP4(groupInfo.pcGroup->groupdata_size);
        AI_SWAP4(groupInfo.pcGroup->numskins);
        AI_SWAP4(groupInfo.pcGroup->num_stpts);
        AI_SWAP4(groupInfo.pcGroup->numtris);
        AI_SWAP4(groupInfo.pcGroup->numverts);
        AI_SWAP4(groupInfo.pcGroup->numframes);

        if (1 != groupInfo.pcGroup->typ)    {
            // Not a triangle-based mesh
            ASSIMP_LOG_WARN("[3DGS MDL7] Not a triangle mesh group. Continuing happily");
        }

        // store the name of the group
        const unsigned int ofs = iGroup*AI_MDL7_MAX_GROUPNAMESIZE;
        ::memcpy(&aszGroupNameBuffer[ofs],
            groupInfo.pcGroup->name,AI_MDL7_MAX_GROUPNAMESIZE);

        // make sure '\0' is at the end
        aszGroupNameBuffer[ofs+AI_MDL7_MAX_GROUPNAMESIZE-1] = '\0';

        // read all skins
        sharedData.pcMats.reserve(sharedData.pcMats.size() + groupInfo.pcGroup->numskins);
        sharedData.abNeedMaterials.resize(sharedData.abNeedMaterials.size() +
            groupInfo.pcGroup->numskins,false);

        for (unsigned int iSkin = 0; iSkin < (unsigned int)groupInfo.pcGroup->numskins;++iSkin) {
            ParseSkinLump_3DGS_MDL7(szCurrent,&szCurrent,sharedData.pcMats);
        }
        // if we have absolutely no skin loaded we need to generate a default material
        if (sharedData.pcMats.empty())  {
            const int iMode = (int)aiShadingMode_Gouraud;
            sharedData.pcMats.push_back(new aiMaterial());
            aiMaterial* pcHelper = (aiMaterial*)sharedData.pcMats[0];
            pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

            aiColor3D clr;
            clr.b = clr.g = clr.r = 0.6f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

            clr.b = clr.g = clr.r = 0.05f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

            aiString szName;
            szName.Set(AI_DEFAULT_MATERIAL_NAME);
            pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

            sharedData.abNeedMaterials.resize(1,false);
        }

        // now get a pointer to all texture coords in the group
        groupInfo.pcGroupUVs = (BE_NCONST MDL::TexCoord_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->num_stpts; ++i){
            AI_SWAP4(groupInfo.pcGroupUVs[i].u);
            AI_SWAP4(groupInfo.pcGroupUVs[i].v);
        }
        szCurrent += pcHeader->skinpoint_stc_size * groupInfo.pcGroup->num_stpts;

        // now get a pointer to all triangle in the group
        groupInfo.pcGroupTris = (Triangle_MDL7*)szCurrent;
        szCurrent += pcHeader->triangle_stc_size * groupInfo.pcGroup->numtris;

        // now get a pointer to all vertices in the group
        groupInfo.pcGroupVerts = (BE_NCONST MDL::Vertex_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->numverts; ++i){
            AI_SWAP4(groupInfo.pcGroupVerts[i].x);
            AI_SWAP4(groupInfo.pcGroupVerts[i].y);
            AI_SWAP4(groupInfo.pcGroupVerts[i].z);

            AI_SWAP2(groupInfo.pcGroupVerts[i].vertindex);
            //We can not swap the normal information now as we don't know which of the two kinds it is
        }
        szCurrent += pcHeader->mainvertex_stc_size * groupInfo.pcGroup->numverts;
        VALIDATE_FILE_SIZE(szCurrent);

        MDL::IntSplitGroupData_MDL7 splitGroupData(sharedData,avOutList[iGroup]);
        MDL::IntGroupData_MDL7 groupData;
        if (groupInfo.pcGroup->numtris && groupInfo.pcGroup->numverts)
        {
            // build output vectors
            const unsigned int iNumVertices = groupInfo.pcGroup->numtris*3;
            groupData.vPositions.resize(iNumVertices);
            groupData.vNormals.resize(iNumVertices);

            if (sharedData.apcOutBones)groupData.aiBones.resize(iNumVertices,UINT_MAX);

            // it is also possible that there are 0 UV coordinate sets
            if (groupInfo.pcGroup->num_stpts){
                groupData.vTextureCoords1.resize(iNumVertices,aiVector3D());

                // check whether the triangle data structure is large enough
                // to contain a second UV coordinate set
                if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_TWO_UV)    {
                    groupData.vTextureCoords2.resize(iNumVertices,aiVector3D());
                    groupData.bNeed2UV = true;
                }
            }
            groupData.pcFaces.resize(groupInfo.pcGroup->numtris);

            // read all faces into the preallocated arrays
            ReadFaces_3DGS_MDL7(groupInfo, groupData);

            // sort by materials
            SortByMaterials_3DGS_MDL7(groupInfo, groupData,
                splitGroupData);

            for (unsigned int qq = 0; qq < sharedData.pcMats.size();++qq)   {
                if (!splitGroupData.aiSplit[qq]->empty())
                    sharedData.abNeedMaterials[qq] = true;
            }
        }
        else ASSIMP_LOG_WARN("[3DGS MDL7] Mesh group consists of 0 "
            "vertices or faces. It will be skipped.");

        // process all frames and generate output meshes
        ProcessFrames_3DGS_MDL7(groupInfo,groupData, sharedData,szCurrent,&szCurrent);
        GenerateOutputMeshes_3DGS_MDL7(groupData,splitGroupData);
    }

    // generate a nodegraph and subnodes for each group
    pScene->mRootNode = new aiNode();

    // now we need to build a final mesh list
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        pScene->mNumMeshes += (unsigned int)avOutList[i].size();

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];  {
        unsigned int p = 0,q = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            for (unsigned int a = 0; a < avOutList[i].size();++a)   {
                pScene->mMeshes[p++] = avOutList[i][a];
            }
            if (!avOutList[i].empty())++pScene->mRootNode->mNumChildren;
        }
        // we will later need an extra node to serve as parent for all bones
        if (sharedData.apcOutBones)++pScene->mRootNode->mNumChildren;
        this->pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
        p = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            if (avOutList[i].empty())continue;

            aiNode* const pcNode = pScene->mRootNode->mChildren[p] = new aiNode();
            pcNode->mNumMeshes = (unsigned int)avOutList[i].size();
            pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
            pcNode->mParent = this->pScene->mRootNode;
            for (unsigned int a = 0; a < pcNode->mNumMeshes;++a)
                pcNode->mMeshes[a] = q + a;
            q += (unsigned int)avOutList[i].size();

            // setup the name of the node
            char* const szBuffer = &aszGroupNameBuffer[i*AI_MDL7_MAX_GROUPNAMESIZE];
			if ('\0' == *szBuffer) {
				const size_t maxSize(buffersize - (i*AI_MDL7_MAX_GROUPNAMESIZE));
				pcNode->mName.length = ai_snprintf(szBuffer, maxSize, "Group_%u", p);
			} else {
				pcNode->mName.length = ::strlen(szBuffer);
			}
            ::strncpy(pcNode->mName.data,szBuffer,MAXLEN-1);
            ++p;
        }
    }

    // if there is only one root node with a single child we can optimize it a bit ...
    if (1 == pScene->mRootNode->mNumChildren && !sharedData.apcOutBones)    {
        aiNode* pcOldRoot = this->pScene->mRootNode;
        pScene->mRootNode = pcOldRoot->mChildren[0];
        pcOldRoot->mChildren[0] = NULL;
        delete pcOldRoot;
        pScene->mRootNode->mParent = NULL;
    }
    else pScene->mRootNode->mName.Set("<mesh_root>");

    delete[] avOutList;
    delete[] aszGroupNameBuffer;
    AI_DEBUG_INVALIDATE_PTR(avOutList);
    AI_DEBUG_INVALIDATE_PTR(aszGroupNameBuffer);

    // build a final material list.
    CopyMaterials_3DGS_MDL7(sharedData);
    HandleMaterialReferences_3DGS_MDL7();

    // generate output bone animations and add all bones to the scenegraph
    if (sharedData.apcOutBones) {
        // this step adds empty dummy bones to the nodegraph
        // insert another dummy node to avoid name conflicts
        aiNode* const pc = pScene->mRootNode->mChildren[pScene->mRootNode->mNumChildren-1] = new aiNode();

        pc->mName.Set("<skeleton_root>");

        // add bones to the nodegraph
        AddBonesToNodeGraph_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones,pc,0xffff);

        // this steps build a valid output animation
        BuildOutputAnims_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones);
    }
}